

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeop.cc
# Opt level: O1

void __thiscall
TypeOpFloatFloor::TypeOpFloatFloor(TypeOpFloatFloor *this,TypeFactory *t,Translate *trans)

{
  OpBehavior *pOVar1;
  string local_40;
  
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"FLOOR","");
  TypeOp::TypeOp((TypeOp *)this,t,CPUI_FLOAT_FLOOR,&local_40);
  (this->super_TypeOpFunc).super_TypeOp._vptr_TypeOp = (_func_int **)&PTR_setMetatypeIn_003c0af0;
  (this->super_TypeOpFunc).metaout = TYPE_FLOAT;
  (this->super_TypeOpFunc).metain = TYPE_FLOAT;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  (this->super_TypeOpFunc).super_TypeOp._vptr_TypeOp = (_func_int **)&PTR_setMetatypeIn_003c18b8;
  (this->super_TypeOpFunc).super_TypeOp.opflags = 0x48000;
  pOVar1 = (OpBehavior *)operator_new(0x18);
  pOVar1->opcode = CPUI_FLOAT_FLOOR;
  pOVar1->isunary = true;
  pOVar1->isspecial = false;
  pOVar1->_vptr_OpBehavior = (_func_int **)&PTR__OpBehavior_003cc1f8;
  pOVar1[1]._vptr_OpBehavior = (_func_int **)trans;
  (this->super_TypeOpFunc).super_TypeOp.behave = pOVar1;
  return;
}

Assistant:

TypeOpFloatFloor::TypeOpFloatFloor(TypeFactory *t,const Translate *trans)
  : TypeOpFunc(t,CPUI_FLOAT_FLOOR,"FLOOR",TYPE_FLOAT,TYPE_FLOAT)
{
  opflags = PcodeOp::unary | PcodeOp::floatingpoint;
  behave = new OpBehaviorFloatFloor(trans);
}